

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref cashew::ValueBuilder::makeNew(Ref call)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  void *__ptr;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = Value::setArray(pVVar2,2);
  __ptr = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,__ptr);
  (RVar3.inst)->type = String;
  pcVar1 = _VTT;
  ((RVar3.inst)->field_1).str.str._M_len = NEW;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = Value::push_back(pVVar2,RVar3);
  RVar3.inst = Value::push_back(pVVar2,call);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeNew(Ref call) {
    return &makeRawArray(2)->push_back(makeRawString(NEW)).push_back(call);
  }